

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sLongShaderTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Stress::anon_unknown_0::LongShaderGenerator::addLine
          (LongShaderGenerator *this,string *text)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_40 [2];
  long local_30 [2];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct
            ((ulong)local_40,
             (char)((long)(this->m_scopes).
                          super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_scopes).
                          super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x55);
  std::__cxx11::string::_M_append((char *)&this->m_source,(ulong)local_40[0]);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  pcVar1 = (text->_M_dataplus)._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + text->_M_string_length);
  std::__cxx11::string::append((char *)local_40);
  std::__cxx11::string::_M_append((char *)&this->m_source,(ulong)local_40[0]);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

void LongShaderGenerator::addLine (const std::string& text)
{
	addIndent();
	m_source += text + "\n";
}